

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualMappedPointerVector.hpp
# Opt level: O3

optional<unsigned_long> __thiscall
gmlc::containers::
DualMappedPointerVector<helics::PublicationInfo,std::__cxx11::string,helics::InterfaceHandle>::
insert<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
          (DualMappedPointerVector<helics::PublicationInfo,std::__cxx11::string,helics::InterfaceHandle>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchValue1,
          InterfaceHandle *searchValue2,GlobalHandle *data,
          basic_string_view<char,_std::char_traits<char>_> *data_1,
          basic_string_view<char,_std::char_traits<char>_> *data_2,
          basic_string_view<char,_std::char_traits<char>_> *data_3)

{
  string_view pkey;
  string_view ptype;
  string_view punits;
  iterator iVar1;
  tuple<helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_> this_00;
  undefined8 uVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false,_false>,_bool>
  pVar3;
  optional<unsigned_long> oVar4;
  size_type index;
  __uniq_ptr_impl<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> local_50;
  InterfaceHandle *local_48;
  GlobalHandle *local_40;
  _Storage<unsigned_long,_true> local_38;
  
  local_40 = data;
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(this + 0x18),searchValue1);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    local_38 = (_Storage<unsigned_long,_true>)
               std::
               _Hashtable<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::InterfaceHandle>,_std::hash<helics::InterfaceHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::InterfaceHandle>,_std::hash<helics::InterfaceHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)(this + 0x50),searchValue2);
    if ((__node_type *)local_38._M_value != (__node_type *)0x0) {
      uVar2 = 0;
      goto LAB_002dff07;
    }
  }
  local_38._M_value = *(long *)(this + 8) - *(long *)this >> 3;
  local_48 = searchValue2;
  this_00.
  super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>.
  super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>)
       operator_new(0x118);
  pkey._M_len = data_1->_M_len;
  pkey._M_str = data_1->_M_str;
  ptype._M_len = data_2->_M_len;
  ptype._M_str = data_2->_M_str;
  punits._M_len = data_3->_M_len;
  punits._M_str = data_3->_M_str;
  helics::PublicationInfo::PublicationInfo
            ((PublicationInfo *)
             this_00.
             super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
             .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl,*local_40,pkey,
             ptype,punits);
  local_50._M_t.
  super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>.
  super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl =
       (tuple<helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>)
       (tuple<helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>)
       this_00.
       super__Tuple_impl<0UL,_helics::PublicationInfo_*,_std::default_delete<helics::PublicationInfo>_>
       .super__Head_base<0UL,_helics::PublicationInfo_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<helics::PublicationInfo,std::default_delete<helics::PublicationInfo>>,std::allocator<std::unique_ptr<helics::PublicationInfo,std::default_delete<helics::PublicationInfo>>>>
  ::
  emplace_back<std::unique_ptr<helics::PublicationInfo,std::default_delete<helics::PublicationInfo>>>
            ((vector<std::unique_ptr<helics::PublicationInfo,std::default_delete<helics::PublicationInfo>>,std::allocator<std::unique_ptr<helics::PublicationInfo,std::default_delete<helics::PublicationInfo>>>>
              *)this,(unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                      *)&local_50);
  std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>::
  ~unique_ptr((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *)
              &local_50);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string_const&,unsigned_long&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)(this + 0x18),searchValue1,&local_38);
  pVar3 = std::
          _Hashtable<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,unsigned_long>,std::allocator<std::pair<helics::InterfaceHandle_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::InterfaceHandle>,std::hash<helics::InterfaceHandle>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<helics::InterfaceHandle_const&,unsigned_long&>
                    ((_Hashtable<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,unsigned_long>,std::allocator<std::pair<helics::InterfaceHandle_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::InterfaceHandle>,std::hash<helics::InterfaceHandle>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 0x50),local_48,&local_38);
  uVar2 = CONCAT71(pVar3._9_7_,1);
LAB_002dff07:
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_38._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            const searchType1& searchValue1,
            const searchType2& searchValue2,
            Us&&... data)
        {
            auto fnd = lookup1.find(searchValue1);
            if (fnd != lookup1.end()) {
                auto fnd2 = lookup2.find(searchValue2);
                if (fnd2 != lookup2.end()) {
                    return std::nullopt;
                }
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(
                std::make_unique<VType>(std::forward<Us>(data)...));
            lookup1.emplace(searchValue1, index);
            lookup2.emplace(searchValue2, index);
            return index;
        }